

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O2

bool __thiscall
boost::numeric::ublas::
compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::const_iterator2::operator==(const_iterator2 *this,const_iterator2 *it)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  
  if ((this->rank_ == 1) || (it->rank_ == 1)) {
    bVar4 = this->it_ == it->it_;
  }
  else {
    auVar1._0_8_ = it->i_;
    auVar1._8_8_ = it->j_;
    auVar2._0_8_ = this->i_;
    auVar2._8_8_ = this->j_;
    uVar3 = vpcmpeqq_avx512vl(auVar1,auVar2);
    bVar4 = ((byte)uVar3 & 3) == 3;
  }
  return bVar4;
}

Assistant:

BOOST_UBLAS_INLINE
            bool operator == (const const_iterator2 &it) const {
                BOOST_UBLAS_CHECK (&(*this) () == &it (), external_logic ());
                // BOOST_UBLAS_CHECK (rank_ == it.rank_, internal_logic ());
                if (rank_ == 1 || it.rank_ == 1) {
                    return it_ == it.it_;
                } else {
                    return i_ == it.i_ && j_ == it.j_;
                }
            }